

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_reduce_is_2k(mp_int *a)

{
  int iVar1;
  mp_int *in_RDI;
  mp_digit iz;
  int iw;
  int iy;
  int ix;
  ulong local_28;
  int local_1c;
  int local_14;
  int local_4;
  
  if (in_RDI->used == 0) {
    local_4 = 0;
  }
  else if (in_RDI->used == 1) {
    local_4 = 1;
  }
  else {
    if (1 < in_RDI->used) {
      iVar1 = mp_count_bits(in_RDI);
      local_28 = 1;
      local_1c = 1;
      for (local_14 = 0x3c; local_14 < iVar1; local_14 = local_14 + 1) {
        if ((in_RDI->dp[local_1c] & local_28) == 0) {
          return 0;
        }
        local_28 = local_28 << 1;
        if (0xfffffffffffffff < local_28) {
          local_1c = local_1c + 1;
          local_28 = 1;
        }
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int mp_reduce_is_2k(mp_int *a)
{
   int ix, iy, iw;
   mp_digit iz;
   
   if (a->used == 0) {
      return MP_NO;
   } else if (a->used == 1) {
      return MP_YES;
   } else if (a->used > 1) {
      iy = mp_count_bits(a);
      iz = 1;
      iw = 1;
    
      /* Test every bit from the second digit up, must be 1 */
      for (ix = DIGIT_BIT; ix < iy; ix++) {
          if ((a->dp[iw] & iz) == 0) {
             return MP_NO;
          }
          iz <<= 1;
          if (iz > (mp_digit)MP_MASK) {
             ++iw;
             iz = 1;
          }
      }
   }
   return MP_YES;
}